

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<1>_>
          *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  wchar_t __tmp;
  ulong uVar7;
  ulong uVar8;
  wchar_t *local_48;
  ulong local_40;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<1>_>
  *local_38;
  
  uVar6 = (ulong)spec->width_;
  uVar8 = f->size_;
  uVar3 = uVar6 - uVar8;
  if (uVar6 < uVar8 || uVar3 == 0) {
    puVar2 = *(undefined8 **)this;
    lVar4 = puVar2[2];
    uVar8 = uVar8 + lVar4;
    if ((ulong)puVar2[3] < uVar8) {
      (**(code **)*puVar2)(puVar2,uVar8);
    }
    puVar2[2] = uVar8;
    local_48 = (wchar_t *)(lVar4 * 4 + puVar2[1]);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
                  *)f,&local_48);
  }
  else {
    puVar2 = *(undefined8 **)this;
    lVar4 = puVar2[2];
    uVar7 = lVar4 + uVar6;
    if ((ulong)puVar2[3] < uVar7) {
      local_40 = uVar3;
      local_38 = f;
      (**(code **)*puVar2)(puVar2,uVar7);
      uVar3 = local_40;
      f = local_38;
    }
    puVar2[2] = uVar7;
    pwVar5 = (wchar_t *)(lVar4 * 4 + puVar2[1]);
    wVar1 = spec->fill_;
    local_48 = pwVar5;
    if (spec->align_ == ALIGN_CENTER) {
      uVar7 = uVar3 >> 1;
      if (1 < uVar3) {
        local_48 = pwVar5 + uVar7;
        lVar4 = 0;
        do {
          *(wchar_t *)((long)pwVar5 + lVar4) = wVar1;
          lVar4 = lVar4 + 4;
        } while (uVar7 * 4 - lVar4 != 0);
      }
      local_40 = uVar3;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
                    *)f,&local_48);
      if (uVar6 != uVar8) {
        lVar4 = 0;
        do {
          *(wchar_t *)((long)local_48 + lVar4) = wVar1;
          lVar4 = lVar4 + 4;
        } while (uVar6 * 4 + uVar8 * -4 + uVar7 * -4 != lVar4);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar6 != uVar8) {
        local_48 = pwVar5 + uVar3;
        lVar4 = 0;
        do {
          *(wchar_t *)((long)pwVar5 + lVar4) = wVar1;
          lVar4 = lVar4 + 4;
        } while (uVar6 * 4 + uVar8 * -4 != lVar4);
      }
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
                    *)f,&local_48);
    }
    else {
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
                    *)f,&local_48);
      if (uVar6 != uVar8) {
        lVar4 = 0;
        do {
          *(wchar_t *)((long)local_48 + lVar4) = wVar1;
          lVar4 = lVar4 + 4;
        } while (uVar6 * 4 + uVar8 * -4 != lVar4);
      }
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }